

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_internal.cpp
# Opt level: O3

bool cfd::TransactionContextUtil::IsOpTrueLockingScript(UtxoData *utxo,AbstractTxIn *txin)

{
  char cVar1;
  int iVar2;
  ScriptOperator *this;
  CfdException *pCVar3;
  bool bVar4;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> locking_script_items;
  Script local_70;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> local_38;
  
  cfd::core::Script::GetElementList();
  if ((long)local_38.
            super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_38.
            super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
            _M_impl.super__Vector_impl_data._M_start == 0x60) {
    this = (ScriptOperator *)cfd::core::ScriptElement::GetOpCode();
    cVar1 = cfd::core::ScriptOperator::operator==
                      (this,(ScriptOperator *)&core::ScriptOperator::OP_TRUE);
    if (cVar1 != '\0') {
      iVar2 = cfd::core::AbstractTxIn::GetScriptWitnessStackNum();
      if (iVar2 != 0) {
        pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
        local_70._vptr_Script =
             (_func_int **)
             ((long)&local_70.script_data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"Exist witness stack. OP_TRUE is unused.","");
        core::CfdException::CfdException(pCVar3,kCfdIllegalStateError,(string *)&local_70);
        __cxa_throw(pCVar3,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      cfd::core::AbstractTxIn::GetUnlockingScript();
      cVar1 = cfd::core::Script::IsEmpty();
      core::Script::~Script(&local_70);
      bVar4 = true;
      if (cVar1 == '\0') {
        pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
        local_70._vptr_Script =
             (_func_int **)
             ((long)&local_70.script_data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"Exist scriptsig. OP_TRUE is unused.","");
        core::CfdException::CfdException(pCVar3,kCfdIllegalStateError,(string *)&local_70);
        __cxa_throw(pCVar3,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      goto LAB_001c80ab;
    }
  }
  bVar4 = false;
LAB_001c80ab:
  std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
            (&local_38);
  return bVar4;
}

Assistant:

bool TransactionContextUtil::IsOpTrueLockingScript(
    const UtxoData& utxo, const AbstractTxIn* txin) {
  std::vector<ScriptElement> locking_script_items =
      utxo.locking_script.GetElementList();
  if (locking_script_items.size() == 1) {
    if (locking_script_items[0].GetOpCode() == ScriptOperator::OP_TRUE) {
      if (txin->GetScriptWitnessStackNum() != 0) {
        throw CfdException(
            CfdError::kCfdIllegalStateError,
            "Exist witness stack. OP_TRUE is unused.");
      }
      if (!txin->GetUnlockingScript().IsEmpty()) {
        throw CfdException(
            CfdError::kCfdIllegalStateError,
            "Exist scriptsig. OP_TRUE is unused.");
      }
      return true;  // OP_TRUE only.
    }
  }
  return false;
}